

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

bool __thiscall flatbuffers::ts::TsGenerator::generateBundle(TsGenerator *this)

{
  ostream *poVar1;
  allocator<char> local_121;
  string local_120 [8];
  string cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string bundlepath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_50 [8];
  string symbolic_name;
  string inputpath;
  TsGenerator *this_local;
  
  if (((((this->super_BaseGenerator).parser_)->opts).ts_flat_files & 1U) != 0) {
    std::__cxx11::string::string((string *)(symbolic_name.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_50,(string *)(this->super_BaseGenerator).file_name_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&bundlepath.field_2 + 8),(this->super_BaseGenerator).path_,
                   (this->super_BaseGenerator).file_name_);
    std::operator+(&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&bundlepath.field_2 + 8),".ts");
    std::__cxx11::string::operator=
              ((string *)(symbolic_name.field_2._M_local_buf + 8),(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)(bundlepath.field_2._M_local_buf + 8));
    BaseGenerator::GeneratedFileName
              ((string *)local_c0,&this->super_BaseGenerator,(this->super_BaseGenerator).path_,
               (this->super_BaseGenerator).file_name_,&((this->super_BaseGenerator).parser_)->opts);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)((long)&cmd.field_2 + 8),(ulong)local_c0);
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&cmd.field_2 + 8),".js");
    std::__cxx11::string::operator=((string *)local_c0,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)(cmd.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_120,"esbuild",&local_121);
    std::allocator<char>::~allocator(&local_121);
    std::__cxx11::string::operator+=(local_120," ");
    std::__cxx11::string::operator+=(local_120,(string *)(symbolic_name.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=(local_120," --format=cjs --bundle --outfile=");
    std::__cxx11::string::operator+=(local_120,(string *)local_c0);
    std::__cxx11::string::operator+=(local_120," --external:flatbuffers");
    poVar1 = std::operator<<((ostream *)&std::cout,"Entry point ");
    poVar1 = std::operator<<(poVar1,(string *)(symbolic_name.field_2._M_local_buf + 8));
    poVar1 = std::operator<<(poVar1," generated.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "A single file bundle can be created using fx. esbuild with:");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"> ");
    poVar1 = std::operator<<(poVar1,local_120);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)(symbolic_name.field_2._M_local_buf + 8));
  }
  return true;
}

Assistant:

bool generateBundle() {
    if (parser_.opts.ts_flat_files) {
      std::string inputpath;
      std::string symbolic_name = file_name_;
      inputpath = path_ + file_name_ + ".ts";
      std::string bundlepath =
          GeneratedFileName(path_, file_name_, parser_.opts);
      bundlepath = bundlepath.substr(0, bundlepath.size() - 3) + ".js";
      std::string cmd = "esbuild";
      cmd += " ";
      cmd += inputpath;
      // cmd += " --minify";
      cmd += " --format=cjs --bundle --outfile=";
      cmd += bundlepath;
      cmd += " --external:flatbuffers";
      std::cout << "Entry point " << inputpath << " generated." << std::endl;
      std::cout << "A single file bundle can be created using fx. esbuild with:"
                << std::endl;
      std::cout << "> " << cmd << std::endl;
    }
    return true;
  }